

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_creation.cpp
# Opt level: O2

void build_kd_tree_with_data_move(void)

{
  max_leaf_size_t max_leaf_size;
  space points;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  tree2;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  tree1;
  splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> local_15a;
  splitter_rule_t<pico_tree::sliding_midpoint_max_side_t> local_159;
  undefined8 local_158;
  _Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_150;
  _Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_138;
  _Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> local_118;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  local_100;
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  local_88;
  
  local_158 = 0xc;
  make_point_set();
  local_138._M_impl.super__Vector_impl_data._M_start =
       local_118._M_impl.super__Vector_impl_data._M_start;
  local_138._M_impl.super__Vector_impl_data._M_finish =
       local_118._M_impl.super__Vector_impl_data._M_finish;
  local_138._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_118._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
            ((kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
              *)&local_88,(space_type *)&local_138,
             (splitter_stop_condition_t<pico_tree::max_leaf_size_t> *)&local_158,
             (splitter_start_bounds_t<pico_tree::bounds_from_space_t> *)&local_100,&local_15a);
  std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~_Vector_base
            (&local_138);
  make_point_set();
  pico_tree::
  kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
  ::
  kd_tree<pico_tree::max_leaf_size_t,pico_tree::bounds_from_space_t,pico_tree::sliding_midpoint_max_side_t>
            ((kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>
              *)&local_100,(space_type *)&local_150,
             (splitter_stop_condition_t<pico_tree::max_leaf_size_t> *)&local_158,
             (splitter_start_bounds_t<pico_tree::bounds_from_space_t> *)&local_15a,&local_159);
  std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~_Vector_base
            (&local_150);
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (&local_88);
  query_tree<pico_tree::kd_tree<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>,pico_tree::metric_l2_squared,int>>
            (&local_100);
  pico_tree::
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  ::~kd_tree(&local_100);
  pico_tree::
  kd_tree<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>,_pico_tree::metric_l2_squared,_int>
  ::~kd_tree(&local_88);
  std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::~_Vector_base
            (&local_118);
  return;
}

Assistant:

void build_kd_tree_with_data_move() {
  pico_tree::max_leaf_size_t max_leaf_size = 12;
  auto points = make_point_set();

  pico_tree::kd_tree<space> tree1(std::move(points), max_leaf_size);

  pico_tree::kd_tree<space> tree2(make_point_set(), max_leaf_size);

  query_tree(tree1);

  query_tree(tree2);
}